

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diplodocus.cpp
# Opt level: O2

string * diplo::memory_usage_abi_cxx11_(void)

{
  size_type *psVar1;
  char cVar2;
  istream *piVar3;
  long lVar4;
  string *in_RDI;
  istream local_260 [8];
  ifstream my;
  size_type *local_58;
  string l;
  
  psVar1 = &l._M_string_length;
  l._M_dataplus._M_p = (pointer)0x0;
  l._M_string_length._0_1_ = 0;
  local_58 = psVar1;
  std::ifstream::ifstream(local_260,"/proc/self/status",_S_in);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
LAB_0012627d:
    std::__cxx11::string::string
              ((string *)in_RDI,"no data",(allocator *)(l.field_2._M_local_buf + 0xf));
  }
  else {
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (local_260,(string *)&local_58);
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
        std::ifstream::close();
        goto LAB_0012627d;
      }
      lVar4 = std::__cxx11::string::find((char *)&local_58,0x140050);
    } while (lVar4 == -1);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if (local_58 == psVar1) {
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(l._M_string_length._1_7_,(undefined1)l._M_string_length);
      *(size_type *)((long)&in_RDI->field_2 + 8) = l.field_2._M_allocated_capacity;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = (pointer)local_58;
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(l._M_string_length._1_7_,(undefined1)l._M_string_length);
    }
    in_RDI->_M_string_length = (size_type)l._M_dataplus._M_p;
    l._M_dataplus._M_p = (pointer)0x0;
    l._M_string_length._0_1_ = 0;
    local_58 = psVar1;
  }
  std::ifstream::~ifstream(local_260);
  std::__cxx11::string::~string((string *)&local_58);
  return in_RDI;
}

Assistant:

string diplo::memory_usage() {
    string l;
    ifstream my("/proc/self/status");
    if (my.is_open()) {
        while (getline(my, l)) {
            if (l.find("VmSize:") != string::npos) {
                return l;
            }
        }
        my.close();
    }
    return "no data";

}